

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O3

void going_set_snd_timeo(int sockfd,int sec,int usec)

{
  int iVar1;
  int *piVar2;
  socklen_t __len;
  socklen_t *__addr_len;
  sockaddr *__addr;
  ulong uVar3;
  ulong uVar4;
  timeval time;
  long local_10;
  long local_8;
  
  local_10 = (long)sec;
  local_8 = (long)usec;
  iVar1 = setsockopt(sockfd,1,0x15,&local_10,0x10);
  if (-1 < iVar1) {
    return;
  }
  going_set_snd_timeo();
  uVar3 = 2;
  __addr = (sockaddr *)0x1;
  iVar1 = socket(2,1,0);
  if (-1 < iVar1) {
    return;
  }
  going_socket();
  iVar1 = listen((int)uVar3,(int)__addr);
  if (iVar1 != -1) {
    return;
  }
  going_listen();
  iVar1 = bind((int)uVar3,__addr,__len);
  if (-1 < iVar1) {
    return;
  }
  going_bind();
  uVar4 = uVar3;
  do {
    iVar1 = accept((int)uVar4,__addr,__addr_len);
    if (0 < iVar1) {
      return;
    }
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 < 0x47) {
        if ((iVar1 != 4) && (iVar1 != 0xb)) {
LAB_001069c3:
          going_accept();
          return;
        }
      }
      else if ((iVar1 != 0x47) && (iVar1 != 0x67)) goto LAB_001069c3;
    }
    uVar4 = uVar3 & 0xffffffff;
  } while( true );
}

Assistant:

void going_set_snd_timeo(int sockfd, int sec, int usec)
 {
 	struct timeval time = {sec, usec};
 	int ret = setsockopt(sockfd, SOL_SOCKET, SO_SNDTIMEO, &time, sizeof(time));
 	if(ret < 0){
 		log_err("setsockopt: SO_SNDTIMEO failed.");
 		exit(-1);
 	}
 }